

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *
BoxNesting::Parser::getBoxes(istream *inputStream)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  istream *in_RSI;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_RDI;
  size_t i;
  stringstream ss_2;
  invalid_argument *e;
  stringstream ss_1;
  out_of_range *e_1;
  stringstream ss;
  int tmp;
  int16_t boxCount;
  string inputLine;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes;
  string *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  Box *in_stack_fffffffffffffa08;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_stack_fffffffffffffa10;
  size_type in_stack_fffffffffffffa28;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_stack_fffffffffffffa30;
  Box local_588;
  ulong local_570;
  undefined1 local_562;
  undefined1 local_1f1;
  stringstream local_1d0 [16];
  ostream local_1c0 [232];
  istream *in_stack_ffffffffffffff28;
  string local_30 [32];
  istream *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_30);
  iVar1 = std::__cxx11::stoi(in_stack_fffffffffffffa00,(size_t *)in_stack_fffffffffffff9f8,0);
  if ((0 < iVar1) && (iVar1 < 0x1389)) {
    local_562 = 0;
    std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::vector
              ((vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *)0x108bd1);
    std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::reserve
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    for (local_570 = 0; local_570 < (ulong)(long)(short)iVar1; local_570 = local_570 + 1) {
      parseBoxSpecification(in_stack_ffffffffffffff28);
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::emplace_back<BoxNesting::Box>
                (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      Box::~Box(&local_588);
    }
    local_562 = 1;
    std::__cxx11::string::~string(local_30);
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar2 = std::operator<<(local_1c0,"Amount of boxes is smaller then 1 or too large, max allowed: "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5000);
  poVar2 = std::operator<<(poVar2,". Got: \"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\"");
  local_1f1 = 1;
  uVar3 = __cxa_allocate_exception(0x18);
  std::__cxx11::stringstream::str();
  ParserError::ParserError((ParserError *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_1f1 = 0;
  __cxa_throw(uVar3,&ParserError::typeinfo,ParserError::~ParserError);
}

Assistant:

std::vector<Box> Parser::getBoxes(std::istream& inputStream)
{
	std::string inputLine;
	std::getline(inputStream, inputLine);

	int16_t boxCount = 0;
	static const auto max = 5000;
	try {
		auto tmp = std::stoi(inputLine);
		if (tmp <= 0 || tmp > max) {
			std::stringstream ss;
			ss << "Amount of boxes is smaller then 1 or too large, max allowed: " << max << ". Got: \"" << tmp << "\"";
			throw ParserError(ss.str());
		}
		boxCount = static_cast<int16_t>(tmp);
	} catch (const std::invalid_argument& e) {
		std::stringstream ss;
		ss << "Expected number to indicate amount of boxes to take from input. Got: \"" << inputLine << "\"";
		throw ParserError(ss.str(), e);
	} catch (const std::out_of_range& e) {
		std::stringstream ss;
		ss << "Number of boxes is too large to handle for this program, max allowed: " << max;
		throw ParserError(ss.str(), e);
	}

	std::vector<Box> boxes;
	boxes.reserve(boxCount);
	for (std::size_t i = 0; i < boxCount; ++i) {
		boxes.emplace_back(parseBoxSpecification(inputStream));
	}

	return boxes;
}